

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O3

void __thiscall HeavyLight_Queries_Test::TestBody(HeavyLight_Queries_Test *this)

{
  long lVar1;
  long lVar2;
  
  srand(1);
  lVar2 = 8;
  do {
    lVar1 = *(long *)((long)pred[0x30d49] + lVar2 + 0x48);
    if (*(long *)((long)&g[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2) != lVar1) {
      *(long *)((long)&g[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2) = lVar1;
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xf8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&chains);
  generateTree(10);
  initHLD(0,10);
  return;
}

Assistant:

TEST(HeavyLight, Queries) {
    srand(1);
    int n = 10;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        rep(a, 0, n) rep(b, a, n) {
            query(a, b);
        }
        break;
    }
}